

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O3

Promise<void> __thiscall kj::_::ForkHub<kj::_::Void>::addBranch(ForkHub<kj::_::Void> *this)

{
  uint *puVar1;
  Own<kj::_::ForkHubBase,_kj::_::ForkHubBase> node;
  _func_int **pp_Var2;
  ForkHubBase *in_RSI;
  Own<kj::_::ForkHubBase,_kj::_::ForkHubBase> local_28;
  _func_int **local_20;
  
  in_RSI->refcount = in_RSI->refcount + 1;
  local_28.ptr = in_RSI;
  PromiseDisposer::
  alloc<kj::_::ForkBranch<kj::_::Void,true>,kj::_::PromiseDisposer,kj::Own<kj::_::ForkHubBase,kj::_::ForkHubBase>>
            ((PromiseDisposer *)&local_20,&local_28);
  pp_Var2 = local_20;
  node.ptr = local_28.ptr;
  local_20 = (_func_int **)0x0;
  (this->super_ForkHubBase).super_PromiseArenaMember._vptr_PromiseArenaMember = pp_Var2;
  if (local_28.ptr != (ForkHubBase *)0x0) {
    local_28.ptr = (ForkHubBase *)0x0;
    puVar1 = &(node.ptr)->refcount;
    *puVar1 = *puVar1 - 1;
    if (*puVar1 == 0) {
      PromiseDisposer::dispose(&(node.ptr)->super_PromiseArenaMember);
    }
  }
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

Own<ForkHubBase, ForkHubBase> addRef() {
    ++refcount;
    return Own<ForkHubBase, ForkHubBase>(this);
  }